

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

file_conflict * file_new(archive_write *a,archive_entry *entry)

{
  mode_t mVar1;
  file_conflict *__ptr;
  archive_entry *paVar2;
  
  __ptr = (file_conflict *)calloc(1,0x170);
  if (__ptr != (file_conflict *)0x0) {
    if (entry == (archive_entry *)0x0) {
      paVar2 = archive_entry_new2(&a->archive);
    }
    else {
      paVar2 = archive_entry_clone(entry);
    }
    __ptr->entry = paVar2;
    if (paVar2 != (archive_entry *)0x0) {
      __archive_rb_tree_init(&__ptr->rbtree,&file_new::rb_ops);
      (__ptr->children).first = (file_conflict *)0x0;
      (__ptr->children).last = &(__ptr->children).first;
      (__ptr->xattr).first = (heap_data *)0x0;
      (__ptr->xattr).last = &(__ptr->xattr).first;
      (__ptr->parentdir).s = (char *)0x0;
      (__ptr->parentdir).length = 0;
      (__ptr->parentdir).buffer_length = 0;
      (__ptr->basename).s = (char *)0x0;
      (__ptr->basename).length = 0;
      (__ptr->basename).buffer_length = 0;
      (__ptr->symlink).s = (char *)0x0;
      (__ptr->symlink).length = 0;
      (__ptr->symlink).buffer_length = 0;
      (__ptr->script).s = (char *)0x0;
      (__ptr->script).length = 0;
      (__ptr->script).buffer_length = 0;
      if (entry == (archive_entry *)0x0) {
        return __ptr;
      }
      mVar1 = archive_entry_filetype(entry);
      if (mVar1 != 0x4000) {
        return __ptr;
      }
      __ptr->field_0x168 = __ptr->field_0x168 | 2;
      return __ptr;
    }
    free(__ptr);
  }
  return (file_conflict *)0x0;
}

Assistant:

static struct file *
file_new(struct archive_write *a, struct archive_entry *entry)
{
	struct file *file;
	static const struct archive_rb_tree_ops rb_ops = {
		file_cmp_node, file_cmp_key
	};

	file = calloc(1, sizeof(*file));
	if (file == NULL)
		return (NULL);

	if (entry != NULL)
		file->entry = archive_entry_clone(entry);
	else
		file->entry = archive_entry_new2(&a->archive);
	if (file->entry == NULL) {
		free(file);
		return (NULL);
	}
	__archive_rb_tree_init(&(file->rbtree), &rb_ops);
	file->children.first = NULL;
	file->children.last = &(file->children.first);
	file->xattr.first = NULL;
	file->xattr.last = &(file->xattr.first);
	archive_string_init(&(file->parentdir));
	archive_string_init(&(file->basename));
	archive_string_init(&(file->symlink));
	archive_string_init(&(file->script));
	if (entry != NULL && archive_entry_filetype(entry) == AE_IFDIR)
		file->dir = 1;

	return (file);
}